

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac-sha1.c
# Opt level: O3

void hmac_sha1(uint8_t *key,size_t key_len,uint8_t *message,size_t message_len,uint8_t *digest)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint8_t fixed_key [64];
  uint8_t inner_digest [20];
  uint8_t outer_pad [64];
  uint8_t inner_pad [64];
  sha1_ctx ctx;
  uint local_178 [16];
  uint8_t local_138 [32];
  uint local_118 [35];
  sha1_ctx local_8c;
  
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[6] = 0;
  local_178[7] = 0;
  local_178[8] = 0;
  local_178[9] = 0;
  local_178[10] = 0;
  local_178[0xb] = 0;
  local_178[0xc] = 0;
  local_178[0xd] = 0;
  local_178[0xe] = 0;
  local_178[0xf] = 0;
  if (key_len < 0x41) {
    memcpy(local_178,key,key_len);
  }
  else {
    sha1_init(&local_8c);
    sha1_update(&local_8c,key,(uint32_t)key_len);
    sha1_finalise(&local_8c,(uint8_t *)local_178);
  }
  lVar5 = 0;
  do {
    uVar1 = *(uint *)((long)local_178 + lVar5);
    uVar2 = *(uint *)((long)local_178 + lVar5 + 4);
    uVar3 = *(uint *)((long)local_178 + lVar5 + 8);
    uVar4 = *(uint *)((long)local_178 + lVar5 + 0xc);
    *(uint *)((long)local_118 + lVar5 + 0x40) = uVar1 ^ 0x36363636;
    *(uint *)((long)local_118 + lVar5 + 0x44) = uVar2 ^ 0x36363636;
    *(uint *)((long)local_118 + lVar5 + 0x48) = uVar3 ^ 0x36363636;
    *(uint *)((long)local_118 + lVar5 + 0x4c) = uVar4 ^ 0x36363636;
    *(uint *)((long)local_118 + lVar5) = uVar1 ^ 0x5c5c5c5c;
    *(uint *)((long)local_118 + lVar5 + 4) = uVar2 ^ 0x5c5c5c5c;
    *(uint *)((long)local_118 + lVar5 + 8) = uVar3 ^ 0x5c5c5c5c;
    *(uint *)((long)local_118 + lVar5 + 0xc) = uVar4 ^ 0x5c5c5c5c;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  sha1_init(&local_8c);
  sha1_update(&local_8c,(uint8_t *)(local_118 + 0x10),0x40);
  sha1_update(&local_8c,message,(uint32_t)message_len);
  sha1_finalise(&local_8c,local_138);
  sha1_init(&local_8c);
  sha1_update(&local_8c,(uint8_t *)local_118,0x40);
  sha1_update(&local_8c,local_138,0x14);
  sha1_finalise(&local_8c,digest);
  return;
}

Assistant:

void hmac_sha1(const uint8_t *key, size_t key_len, const uint8_t *message,
               size_t message_len, uint8_t digest[20]) {
  struct sha1_ctx ctx;
  uint8_t fixed_key[64];
  uint8_t inner_digest[20];
  uint8_t inner_pad[64];
  uint8_t outer_pad[64];

  memset(fixed_key, 0, 64);
  if (key_len > 64) {
    sha1_init(&ctx);
    sha1_update(&ctx, (const uint8_t *)key, key_len);
    sha1_finalise(&ctx, fixed_key);
  } else {
    memcpy(fixed_key, key, key_len > 64 ? 64 : key_len);
  }

  for (int i = 0; i < 64; i++) {
    inner_pad[i] = fixed_key[i] ^ 0x36;
    outer_pad[i] = fixed_key[i] ^ 0x5c;
  }

  // perform inner hash
  sha1_init(&ctx);
  sha1_update(&ctx, inner_pad, 64);
  sha1_update(&ctx, message, message_len);
  sha1_finalise(&ctx, inner_digest);

  sha1_init(&ctx);
  sha1_update(&ctx, outer_pad, 64);
  sha1_update(&ctx, inner_digest, 20);
  sha1_finalise(&ctx, digest);
}